

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_SUNMemory.cpp
# Opt level: O0

SUNMemoryHelper amrex::sundials::anon_unknown_0::CreateMemoryHelper(Context *sunctx)

{
  SUNMemoryHelper p_Var1;
  SUNMemoryHelper helper;
  SUNContext in_stack_ffffffffffffffe8;
  
  ::sundials::Context::operator_cast_to__SUNContext_((Context *)0x2841d3);
  p_Var1 = SUNMemoryHelper_NewEmpty(in_stack_ffffffffffffffe8);
  p_Var1->content = (void *)0x0;
  p_Var1->ops->clone = CloneMemoryHelper;
  p_Var1->ops->alloc = Alloc;
  p_Var1->ops->dealloc = Dealloc;
  p_Var1->ops->destroy = DestroyMemoryHelper;
  return p_Var1;
}

Assistant:

SUNMemoryHelper CreateMemoryHelper(::sundials::Context* sunctx)
    {
        SUNMemoryHelper helper;

        helper = SUNMemoryHelper_NewEmpty(*sunctx);

        helper->content          = NULL;
        helper->ops->clone       = CloneMemoryHelper;
        helper->ops->alloc       = Alloc;
        helper->ops->dealloc     = Dealloc;
        helper->ops->destroy     = DestroyMemoryHelper;
#if defined(AMREX_USE_HIP)
        helper->ops->copy      = SUNMemoryHelper_Copy_Hip;
        helper->ops->copyasync = SUNMemoryHelper_CopyAsync_Hip;
#elif defined(AMREX_USE_CUDA)
        helper->ops->copy      = SUNMemoryHelper_Copy_Cuda;
        helper->ops->copyasync = SUNMemoryHelper_CopyAsync_Cuda;
#elif defined(AMREX_USE_DPCPP)
        helper->ops->copy      = SUNMemoryHelper_Copy_Sycl;
        helper->ops->copyasync = SUNMemoryHelper_CopyAsync_Sycl;
#endif

        return helper;
    }